

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

bool event_track::get_sparse_moov
               (string *urn,uint32_t timescale,uint32_t track_id,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *sparse_moov)

{
  uint32_t uVar1;
  reference pvVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *sparse_moov_local;
  uint32_t track_id_local;
  uint32_t timescale_local;
  string *urn_local;
  
  local_20 = sparse_moov;
  sparse_moov_local._0_4_ = track_id;
  sparse_moov_local._4_4_ = timescale;
  _track_id_local = urn;
  base64_decode(&local_38,&moov_64_enc_abi_cxx11_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_20,&local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  fmp4_stream::set_track_id(local_20,(uint32_t)sparse_moov_local);
  uVar1 = sparse_moov_local._4_4_;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_20,0x1c);
  anon_unknown.dwarf_196ee::fmp4_write_uint32(uVar1,(char *)pvVar2);
  uVar1 = sparse_moov_local._4_4_;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_20,0xf4);
  anon_unknown.dwarf_196ee::fmp4_write_uint32(uVar1,(char *)pvVar2);
  uVar1 = (uint32_t)sparse_moov_local;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_20,0x220);
  anon_unknown.dwarf_196ee::fmp4_write_uint32(uVar1,(char *)pvVar2);
  set_evte(local_20);
  return true;
}

Assistant:

bool event_track::get_sparse_moov(
	const std::string& urn, 
	uint32_t timescale, 
	uint32_t track_id, 
	std::vector<uint8_t> &sparse_moov)
{

	sparse_moov = base64_decode(moov_64_enc);
	set_track_id(sparse_moov, track_id);
	
	// write back the timescale mvhd
	fmp4_write_uint32(timescale, (char *)&sparse_moov[28]);

	// mdhd 
	fmp4_write_uint32(timescale, (char *)&sparse_moov[244]);

	// write back the timescale mvhd / mhd
	fmp4_write_uint32(track_id, (char*)&sparse_moov[544]);

	set_evte(sparse_moov);

	return true;
}